

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O3

uint LZ4HC_countPattern(BYTE *ip,BYTE *iEnd,U32 pattern32)

{
  ulong uVar1;
  ulong *puVar2;
  reg_t patternByte;
  ulong uVar3;
  BYTE *pBVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = (int)ip;
  uVar3 = CONCAT44(pattern32,pattern32);
  pBVar4 = ip;
  if (ip < iEnd + -7) {
    do {
      if (*(ulong *)ip != uVar3) {
        uVar3 = *(ulong *)ip ^ uVar3;
        uVar1 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        puVar2 = (ulong *)(pBVar4 + (uVar1 >> 3 & 0x1fffffff));
        goto LAB_0011f3d7;
      }
      ip = (BYTE *)((long)ip + 8);
      pBVar4 = pBVar4 + 8;
    } while (ip < iEnd + -7);
  }
  puVar2 = (ulong *)ip;
  if (ip < iEnd) {
    lVar5 = (long)iEnd - (long)ip;
    do {
      puVar2 = (ulong *)ip;
      if ((char)*(ulong *)ip != (char)uVar3) break;
      ip = (BYTE *)((long)ip + 1);
      uVar3 = uVar3 >> 8;
      lVar5 = lVar5 + -1;
      puVar2 = (ulong *)iEnd;
    } while (lVar5 != 0);
  }
LAB_0011f3d7:
  return (int)puVar2 - iVar6;
}

Assistant:

static unsigned
LZ4HC_countPattern(const BYTE* ip, const BYTE* const iEnd, U32 const pattern32)
{
    const BYTE* const iStart = ip;
    reg_t const pattern = (sizeof(pattern)==8) ?
        (reg_t)pattern32 + (((reg_t)pattern32) << (sizeof(pattern)*4)) : pattern32;

    while (likely(ip < iEnd-(sizeof(pattern)-1))) {
        reg_t const diff = LZ4_read_ARCH(ip) ^ pattern;
        if (!diff) { ip+=sizeof(pattern); continue; }
        ip += LZ4_NbCommonBytes(diff);
        return (unsigned)(ip - iStart);
    }

    if (LZ4_isLittleEndian()) {
        reg_t patternByte = pattern;
        while ((ip<iEnd) && (*ip == (BYTE)patternByte)) {
            ip++; patternByte >>= 8;
        }
    } else {  /* big endian */
        U32 bitOffset = (sizeof(pattern)*8) - 8;
        while (ip < iEnd) {
            BYTE const byte = (BYTE)(pattern >> bitOffset);
            if (*ip != byte) break;
            ip ++; bitOffset -= 8;
        }
    }

    return (unsigned)(ip - iStart);
}